

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_OBSOLETE_V5_HatchExtra::CopyFrom(ON_OBSOLETE_V5_HatchExtra *this,ON_Object *src)

{
  ON_OBSOLETE_V5_HatchExtra *pOVar1;
  ON_OBSOLETE_V5_HatchExtra *s;
  ON_Object *src_local;
  ON_OBSOLETE_V5_HatchExtra *this_local;
  
  pOVar1 = Cast(src);
  if ((this == (ON_OBSOLETE_V5_HatchExtra *)0x0) || (pOVar1 == (ON_OBSOLETE_V5_HatchExtra *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    operator=(this,pOVar1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

ON_OBSOLETE_V5_HatchExtra* ON_OBSOLETE_V5_HatchExtra::HatchExtension(const ON_Hatch* pHatch)
{
  ON_OBSOLETE_V5_HatchExtra* pExtra = nullptr;
  if(pHatch)
  {
    pExtra = ON_OBSOLETE_V5_HatchExtra::Cast(pHatch->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_HatchExtra)));
    if(pExtra == nullptr)
    {
      pExtra = new ON_OBSOLETE_V5_HatchExtra;
      if(pExtra)
      {
        if(!const_cast<ON_Hatch*>(pHatch)->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = nullptr;
        }
      }  
    }
  }
  return pExtra;
}